

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  uchar *puVar1;
  ushort uVar2;
  Table *pTable;
  sqlite3 *db;
  Parse *yypParser;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  ushort *puVar7;
  ushort uVar8;
  int iVar9;
  YYMINORTYPE *yypminor;
  byte bVar10;
  AutoincInfo *p;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  yyParser sEngine;
  uchar local_d08;
  uint local_d04;
  sqlite3 *local_d00;
  char **local_cf8;
  uchar *local_cf0;
  uint local_ce8;
  YYMINORTYPE local_ce0;
  yyParser local_cc8;
  
  local_d00 = pParse->db;
  iVar14 = local_d00->aLimit[1];
  if (local_d00->nVdbeActive == 0) {
    (local_d00->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  local_cc8.yytos = local_cc8.yystack;
  local_cc8.yystack[0].stateno = 0;
  local_cc8.yystack[0].major = '\0';
  local_cc8.yystackEnd = local_cc8.yystack + 99;
  uVar6 = 0xffffffff;
  uVar3 = 0;
  local_cf8 = pzErrMsg;
LAB_001f3d91:
  if (*zSql == '\0') {
    uVar13 = 0;
    if (uVar6 != 1) {
      if (uVar6 == 0) goto LAB_001f3fe3;
      uVar13 = 1;
    }
    zSql = (char *)((uchar *)zSql + -(long)(int)uVar3);
    local_d04 = uVar13;
LAB_001f3e14:
    uVar6 = local_d04;
    (pParse->sLastToken).z = zSql;
    (pParse->sLastToken).n = uVar3;
    local_cc8.pParse = pParse;
    do {
      yypParser = local_cc8.pParse;
      uVar2 = (local_cc8.yytos)->stateno;
      uVar4 = (ulong)uVar2;
      local_d08 = (uchar)uVar6;
      if (uVar4 < 0x3e1) {
        iVar9 = (int)yy_shift_ofst[uVar4];
        uVar12 = (ulong)uVar6;
        do {
          uVar11 = uVar12 & 0xff;
          uVar13 = (int)uVar11 + iVar9;
          bVar10 = (byte)uVar12;
          if ((uVar13 < 0x61d) && (yy_lookahead[uVar13] == bVar10)) {
            puVar7 = yy_action + uVar13;
            goto LAB_001f3ecd;
          }
        } while ((bVar10 < 0x45) && (uVar12 = (ulong)""[uVar11], ""[uVar11] != 0));
        if (((iVar9 < 0x5d8) && (((uVar2 != 0x68 && (uVar2 != 0xe0)) && (bVar10 != 0)))) &&
           (yy_lookahead[iVar9 + 0x45U] == 'E')) {
          puVar7 = yy_action + (iVar9 + 0x45U);
        }
        else {
          puVar7 = yy_default + uVar4;
        }
LAB_001f3ecd:
        uVar2 = *puVar7;
        uVar4 = (ulong)uVar2;
        if (uVar2 < 0x3e1) {
          if (local_cc8.yystackEnd < local_cc8.yytos + 1) {
            yyStackOverflow(&local_cc8);
          }
          else {
            uVar8 = uVar2 + 0x149;
            if (uVar2 < 0x1c7) {
              uVar8 = uVar2;
            }
            local_cc8.yytos[1].stateno = uVar8;
            local_cc8.yytos[1].major = local_d08;
            local_cc8.yytos[1].minor.yy0.z = zSql;
            local_cc8.yytos[1].minor.yy0.n = uVar3;
            local_cc8.yytos = local_cc8.yytos + 1;
          }
          break;
        }
      }
      if (0x529 < (uint)uVar4) {
        local_cf0 = (uchar *)zSql;
        local_ce8 = uVar3;
        local_ce0.yy72 = (Expr *)zSql;
        local_ce0.yy0.n = uVar3;
        sqlite3ErrorMsg(local_cc8.pParse,"near \"%T\": syntax error",&local_cf0);
        local_cc8.pParse = yypParser;
        yy_destructor((yyParser *)yypParser,local_d08,&local_ce0);
        break;
      }
      yy_reduce(&local_cc8,(uint)uVar4 - 0x3e1);
    } while (local_cc8.yystack < local_cc8.yytos);
    zSql = (char *)((uchar *)zSql + (int)uVar3);
    if ((pParse->rc != 0) || (local_d00->mallocFailed != '\0')) goto LAB_001f3fe3;
    goto LAB_001f3d91;
  }
  uVar3 = sqlite3GetToken((uchar *)zSql,(int *)&local_d04);
  iVar14 = iVar14 - uVar3;
  if (-1 < iVar14) {
    if (0xa2 < (int)local_d04) {
      if ((local_d00->u1).isInterrupted != 0) {
        pParse->rc = 9;
        goto LAB_001f3fe3;
      }
      if (local_d04 == 0xa4) {
        sqlite3ErrorMsg(pParse,"unrecognized token: \"%.*s\"",(ulong)uVar3,zSql);
        goto LAB_001f3fe3;
      }
      zSql = (char *)((uchar *)zSql + (int)uVar3);
      goto LAB_001f3d91;
    }
    goto LAB_001f3e14;
  }
  pParse->rc = 0x12;
LAB_001f3fe3:
  pParse->zTail = zSql;
  while (db = local_d00, local_cc8.yystack < local_cc8.yytos) {
    puVar1 = &(local_cc8.yytos)->major;
    yypminor = &(local_cc8.yytos)->minor;
    local_cc8.yytos = local_cc8.yytos + -1;
    yy_destructor((yyParser *)local_cc8.pParse,*puVar1,yypminor);
  }
  if (local_d00->mallocFailed == '\0') {
    uVar6 = pParse->rc;
    if (((uVar6 == 0) || (uVar6 == 0x65)) || (pParse->zErrMsg != (char *)0x0)) goto LAB_001f40a2;
    if (uVar6 != 0x204) {
      uVar4 = (ulong)(uVar6 & 0xff);
      if ((uVar6 & 0xff) < 0x1b) goto LAB_001f403e;
      goto LAB_001f4087;
    }
    pcVar5 = "abort due to ROLLBACK";
  }
  else {
    pParse->rc = 7;
    if (pParse->zErrMsg != (char *)0x0) goto LAB_001f40a2;
    uVar4 = 7;
LAB_001f403e:
    if ((0x1410004UL >> (uVar4 & 0x3f) & 1) == 0) {
      pcVar5 = *(char **)(sqlite3ErrStr_aMsg + uVar4 * 8);
    }
    else {
LAB_001f4087:
      pcVar5 = "unknown error";
    }
  }
  pcVar5 = sqlite3MPrintf(local_d00,"%s",pcVar5);
  pParse->zErrMsg = pcVar5;
LAB_001f40a2:
  pcVar5 = pParse->zErrMsg;
  if (pcVar5 != (char *)0x0) {
    *local_cf8 = pcVar5;
    sqlite3_log(pParse->rc,"%s");
    pParse->zErrMsg = (char *)0x0;
  }
  if (((pParse->pVdbe != (Vdbe *)0x0) && (0 < pParse->nErr)) && (pParse->nested == '\0')) {
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = (Vdbe *)0x0;
  }
  if (pParse->nested == '\0') {
    if (pParse->aTableLock != (TableLock *)0x0) {
      sqlite3DbFreeNN(db,pParse->aTableLock);
    }
    pParse->aTableLock = (TableLock *)0x0;
    pParse->nTableLock = 0;
  }
  sqlite3_free(pParse->apVtabLock);
  if (pParse->declareVtab == '\0') {
    sqlite3DeleteTable(db,pParse->pNewTable);
  }
  if (pParse->pWithToFree != (With *)0x0) {
    sqlite3WithDelete(db,pParse->pWithToFree);
  }
  sqlite3DeleteTrigger(db,pParse->pNewTrigger);
  p = (AutoincInfo *)pParse->pVList;
  if (p == (AutoincInfo *)0x0) goto LAB_001f4181;
  while( true ) {
    sqlite3DbFreeNN(db,p);
LAB_001f4181:
    p = pParse->pAinc;
    if (p == (AutoincInfo *)0x0) break;
    pParse->pAinc = p->pNext;
  }
  while (pTable = pParse->pZombieTab, pTable != (Table *)0x0) {
    pParse->pZombieTab = pTable->pNextZombie;
    sqlite3DeleteTable(db,pTable);
  }
  return (uint)(pcVar5 != (char *)0x0);
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int n = 0;                      /* Length of the next token token */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  yyParser sEngine;    /* Space to hold the Lemon-generated Parser object */
#endif

  assert( zSql!=0 );
  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->nVdbeActive==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  assert( pzErrMsg!=0 );
  /* sqlite3ParserTrace(stdout, "parser: "); */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  pEngine = &sEngine;
  sqlite3ParserInit(pEngine);
#else
  pEngine = sqlite3ParserAlloc(sqlite3Malloc);
  if( pEngine==0 ){
    sqlite3OomFault(db);
    return SQLITE_NOMEM_BKPT;
  }
#endif
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->pVList==0 );
  while( 1 ){
    if( zSql[0]!=0 ){
      n = sqlite3GetToken((u8*)zSql, &tokenType);
      mxSqlLen -= n;
      if( mxSqlLen<0 ){
        pParse->rc = SQLITE_TOOBIG;
        break;
      }
    }else{
      /* Upon reaching the end of input, call the parser two more times
      ** with tokens TK_SEMI and 0, in that order. */
      if( lastTokenParsed==TK_SEMI ){
        tokenType = 0;
      }else if( lastTokenParsed==0 ){
        break;
      }else{
        tokenType = TK_SEMI;
      }
      zSql -= n;
    }
    if( tokenType>=TK_SPACE ){
      assert( tokenType==TK_SPACE || tokenType==TK_ILLEGAL );
      if( db->u1.isInterrupted ){
        pParse->rc = SQLITE_INTERRUPT;
        break;
      }
      if( tokenType==TK_ILLEGAL ){
        sqlite3ErrorMsg(pParse, "unrecognized token: \"%.*s\"", n, zSql);
        break;
      }
      zSql += n;
    }else{
      pParse->sLastToken.z = zSql;
      pParse->sLastToken.n = n;
      sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
      lastTokenParsed = tokenType;
      zSql += n;
      if( pParse->rc!=SQLITE_OK || db->mallocFailed ) break;
    }
  }
  assert( nErr==0 );
  pParse->zTail = zSql;
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3_mutex_enter(sqlite3MallocMutex());
  sqlite3StatusHighwater(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
  sqlite3_mutex_leave(sqlite3MallocMutex());
#endif /* YYDEBUG */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  sqlite3ParserFinalize(pEngine);
#else
  sqlite3ParserFree(pEngine, sqlite3_free);
#endif
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM_BKPT;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    pParse->zErrMsg = sqlite3MPrintf(db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  if( pParse->pWithToFree ) sqlite3WithDelete(db, pParse->pWithToFree);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->pVList);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFreeNN(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  assert( nErr==0 || pParse->rc!=SQLITE_OK );
  return nErr;
}